

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall
Fl_Text_Display::position_style(Fl_Text_Display *this,int lineStartPos,int lineLen,int lineIndex)

{
  Fl_Text_Buffer *this_00;
  Fl_Text_Buffer *this_01;
  byte bVar1;
  int iVar2;
  int iVar3;
  Fl_Text_Selection *pFVar4;
  uint local_40;
  int style;
  int pos;
  Fl_Text_Buffer *styleBuf;
  Fl_Text_Buffer *buf;
  int lineIndex_local;
  int lineLen_local;
  int lineStartPos_local;
  Fl_Text_Display *this_local;
  
  this_00 = this->mBuffer;
  this_01 = this->mStyleBuffer;
  local_40 = 0;
  if ((lineStartPos == -1) || (this_00 == (Fl_Text_Buffer *)0x0)) {
    this_local._4_4_ = 0x100;
  }
  else {
    iVar2 = min(lineIndex,lineLen);
    iVar2 = lineStartPos + iVar2;
    if (lineIndex < lineLen) {
      if (this_01 != (Fl_Text_Buffer *)0x0) {
        bVar1 = Fl_Text_Buffer::byte_at(this_01,iVar2);
        local_40 = (uint)bVar1;
        if ((local_40 == (int)this->mUnfinishedStyle) &&
           (this->mUnfinishedHighlightCB != (Unfinished_Style_Cb)0x0)) {
          (*this->mUnfinishedHighlightCB)(iVar2,this->mHighlightCBArg);
          bVar1 = Fl_Text_Buffer::byte_at(this_01,iVar2);
          local_40 = (uint)bVar1;
        }
      }
    }
    else {
      local_40 = 0x100;
    }
    pFVar4 = Fl_Text_Buffer::primary_selection(this_00);
    iVar3 = Fl_Text_Selection::includes(pFVar4,iVar2);
    if (iVar3 != 0) {
      local_40 = local_40 | 0x400;
    }
    pFVar4 = Fl_Text_Buffer::highlight_selection(this_00);
    iVar3 = Fl_Text_Selection::includes(pFVar4,iVar2);
    if (iVar3 != 0) {
      local_40 = local_40 | 0x800;
    }
    pFVar4 = Fl_Text_Buffer::secondary_selection(this_00);
    iVar2 = Fl_Text_Selection::includes(pFVar4,iVar2);
    if (iVar2 != 0) {
      local_40 = local_40 | 0x200;
    }
    this_local._4_4_ = local_40;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::position_style( int lineStartPos, int lineLen, int lineIndex) const
{
  IS_UTF8_ALIGNED2(buffer(), lineStartPos)

  Fl_Text_Buffer * buf = mBuffer;
  Fl_Text_Buffer *styleBuf = mStyleBuffer;
  int pos, style = 0;

  if ( lineStartPos == -1 || buf == NULL )
    return FILL_MASK;

  pos = lineStartPos + min( lineIndex, lineLen );

  if ( lineIndex >= lineLen )
    style = FILL_MASK;
  else if ( styleBuf != NULL ) {
    style = ( unsigned char ) styleBuf->byte_at( pos );
    if (style == mUnfinishedStyle && mUnfinishedHighlightCB) {
      /* encountered "unfinished" style, trigger parsing */
      (mUnfinishedHighlightCB)( pos, mHighlightCBArg);
      style = (unsigned char) styleBuf->byte_at( pos);
    }
  }
  if (buf->primary_selection()->includes(pos))
    style |= PRIMARY_MASK;
  if (buf->highlight_selection()->includes(pos))
    style |= HIGHLIGHT_MASK;
  if (buf->secondary_selection()->includes(pos))
    style |= SECONDARY_MASK;
  return style;
}